

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O1

void Curl_wildcard_dtor(WildcardData **wcp)

{
  WildcardData *pWVar1;
  
  pWVar1 = *wcp;
  if (pWVar1 != (WildcardData *)0x0) {
    if (pWVar1->dtor != (wildcard_dtor)0x0) {
      (*pWVar1->dtor)(pWVar1->ftpwc);
      pWVar1->ftpwc = (ftp_wc *)0x0;
      pWVar1->dtor = (wildcard_dtor)0x0;
    }
    Curl_llist_destroy(&pWVar1->filelist,(void *)0x0);
    (*Curl_cfree)(pWVar1->path);
    pWVar1->path = (char *)0x0;
    (*Curl_cfree)(pWVar1->pattern);
    pWVar1->pattern = (char *)0x0;
    pWVar1->state = '\x01';
    (*Curl_cfree)(pWVar1);
    *wcp = (WildcardData *)0x0;
  }
  return;
}

Assistant:

void Curl_wildcard_dtor(struct WildcardData **wcp)
{
  struct WildcardData *wc = *wcp;
  if(!wc)
    return;

  if(wc->dtor) {
    wc->dtor(wc->ftpwc);
    wc->dtor = ZERO_NULL;
    wc->ftpwc = NULL;
  }
  DEBUGASSERT(wc->ftpwc == NULL);

  Curl_llist_destroy(&wc->filelist, NULL);
  free(wc->path);
  wc->path = NULL;
  free(wc->pattern);
  wc->pattern = NULL;
  wc->state = CURLWC_INIT;
  free(wc);
  *wcp = NULL;
}